

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O3

bool __thiscall MinVR::VRMatrix4::operator==(VRMatrix4 *this,VRMatrix4 *m2)

{
  ulong uVar1;
  ulong uVar2;
  
  if (1e-08 < ABS(m2->m[0] - this->m[0])) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0xf) break;
    uVar1 = uVar2 + 1;
  } while (ABS(m2->m[uVar2 + 1] - this->m[uVar2 + 1]) <= 1e-08);
  return 0xe < uVar2;
}

Assistant:

bool VRMatrix4::operator==(const VRMatrix4& m2) const {
  for (int i=0;i<16;i++) {
    if (fabs(m2.m[i] - m[i]) > VRMATH_EPSILON) {
      return false;
    }
  }
  return true;
}